

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O1

int hdr_log_read_entry(hdr_log_reader *reader,FILE *file,hdr_log_entry *entry,
                      hdr_histogram **histogram)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *input;
  uint8_t *output;
  size_t output_len;
  char cVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long lVar7;
  int iVar8;
  bool bVar9;
  size_t local_70;
  ulong local_68;
  size_t local_58;
  
  input = (char *)calloc(0x400,1);
  if (entry == (hdr_log_entry *)0x0) {
    iVar4 = -0x16;
  }
  else {
    local_58 = 0x400;
    iVar4 = -0x16;
    iVar3 = 0;
    local_70 = 0;
    local_68 = 0;
    uVar6 = extraout_RDX;
    do {
      iVar8 = 7;
      cVar5 = (char)uVar6;
      switch(iVar3) {
      case 0:
        iVar1 = fgetc((FILE *)file);
        if (iVar1 != 0x54) {
          if (iVar1 - 0x30U < 10) {
            ungetc(iVar1,(FILE *)file);
            uVar6 = 2;
          }
          else {
            iVar3 = 0;
            uVar6 = extraout_RDX_00;
            if (iVar1 == -1) goto LAB_0010606c;
            if ((iVar1 != 10) && (iVar1 != 0xd)) goto switchD_00105e71_default;
            uVar6 = 0;
          }
          break;
        }
        lVar7 = 0;
        do {
          cVar5 = "Tag="[lVar7 + 1];
          iVar2 = fgetc((FILE *)file);
          if (iVar2 != cVar5) break;
          bVar9 = lVar7 != 2;
          lVar7 = lVar7 + 1;
        } while (bVar9);
        uVar6 = 1;
        iVar3 = 0;
        iVar1 = -0x16;
        if (iVar2 == cVar5) break;
        goto LAB_0010606c;
      case 1:
        iVar1 = fgetc((FILE *)file);
        iVar3 = 1;
        uVar6 = extraout_RDX_01;
        if (iVar1 < 0xd) {
          if ((iVar1 == -1) || (iVar1 == 10)) goto switchD_00105e71_default;
LAB_0010603b:
          uVar6 = 1;
          if ((entry->tag != (char *)0x0) && (local_68 < entry->tag_len)) {
            entry->tag[local_68] = (char)iVar1;
            local_68 = local_68 + 1;
          }
        }
        else {
          if (iVar1 == 0xd) goto switchD_00105e71_default;
          if (iVar1 != 0x2c) goto LAB_0010603b;
          uVar6 = 2;
          if ((entry->tag != (char *)0x0) && (local_68 < entry->tag_len)) {
            entry->tag[local_68] = '\0';
          }
        }
        break;
      case 2:
        iVar3 = read_ahead_timestamp(file,&entry->start_timestamp,cVar5);
        uVar6 = 3;
        if (iVar3 == 0) {
          iVar3 = 2;
          goto switchD_00105e71_default;
        }
        break;
      case 3:
        iVar3 = read_ahead_timestamp(file,&entry->interval,cVar5);
        uVar6 = 4;
        if (iVar3 == 0) {
          iVar3 = 3;
          goto switchD_00105e71_default;
        }
        break;
      case 4:
        iVar3 = read_ahead_timestamp(file,&entry->max,cVar5);
        uVar6 = 5;
        if (iVar3 == 0) {
          iVar3 = 4;
          goto switchD_00105e71_default;
        }
        break;
      case 5:
        iVar3 = fgetc((FILE *)file);
        if ((0xe < iVar3 + 1U) || (uVar6 = 6, (0x4801U >> (iVar3 + 1U & 0x1f) & 1) == 0)) {
          if (local_70 == local_58) {
            local_58 = local_58 * 2;
            input = (char *)realloc(input,local_58);
            if (input == (char *)0x0) {
              iVar3 = 5;
              input = (char *)0x0;
              uVar6 = extraout_RDX_02;
              iVar1 = -0xc;
              goto LAB_0010606c;
            }
          }
          input[local_70] = (char)iVar3;
          local_70 = local_70 + 1;
          uVar6 = 5;
        }
        break;
      default:
switchD_00105e71_default:
        iVar1 = -0x16;
        goto LAB_0010606c;
      }
      iVar8 = 0;
      iVar3 = (int)uVar6;
      iVar1 = iVar4;
LAB_0010606c:
      iVar4 = iVar1;
      if (iVar8 != 0) {
        if (iVar8 != 7) {
          return iVar4;
        }
        output = (uint8_t *)0x0;
        goto LAB_001060ec;
      }
    } while (iVar3 != 6);
    output = (uint8_t *)calloc(local_70,1);
    output_len = hdr_base64_decoded_len(local_70);
    iVar4 = hdr_base64_decode(input,local_70,output,output_len);
    if (iVar4 == 0) {
      iVar4 = hdr_decode_compressed(output,output_len,histogram);
    }
LAB_001060ec:
    free(input);
    free(output);
  }
  return iVar4;
}

Assistant:

int hdr_log_read_entry(
    struct hdr_log_reader* reader, FILE* file, struct hdr_log_entry *entry, struct hdr_histogram** histogram)
{
    enum parse_log_state state = INIT;
    size_t capacity = 1024;
    size_t base64_len = 0;
    size_t tag_offset = 0;
    char* base64_histogram = hdr_calloc(capacity, sizeof(char));
    size_t compressed_len = 0;
    uint8_t* compressed_histogram = NULL;
    int result = -EINVAL;

    (void)reader;

    if (NULL == entry)
    {
        return -EINVAL;
    }

    do
    {
        int c;

        switch (state)
        {
            case INIT:
                c = fgetc(file);
                if ('T' == c)
                {
                    if (read_ahead(file, "ag=", 3))
                    {
                        state = TAG;
                    }
                    else
                    {
                        FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                    }
                }
                else if ('0' <= c && c <= '9')
                {
                    ungetc(c, file);
                    state = BEGIN_TIMESTAMP;
                }
                else if ('\r' == c || '\n' == c)
                {
                    /* Skip over trailing/preceding new lines. */
                }
                else if (EOF == c)
                {
                    FAIL_AND_CLEANUP(cleanup, result, EOF);
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case TAG:
                c = fgetc(file);
                if (',' == c)
                {
                    if (NULL != entry->tag && tag_offset < entry->tag_len)
                    {
                        entry->tag[tag_offset] = '\0';
                    }
                    state = BEGIN_TIMESTAMP;
                }
                else if ('\r' == c || '\n' == c || EOF == c)
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                else
                {
                    if (NULL != entry->tag && tag_offset < entry->tag_len)
                    {
                        entry->tag[tag_offset] = (char) c;
                        tag_offset++;
                    }
                }
                break;
            case BEGIN_TIMESTAMP:
                if (read_ahead_timestamp(file, &entry->start_timestamp, ','))
                {
                    state = INTERVAL;
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case INTERVAL:
                if (read_ahead_timestamp(file, &entry->interval, ','))
                {
                    state = MAX;
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case MAX:
                if (read_ahead_timestamp(file, &entry->max, ','))
                {
                    state = HISTOGRAM;
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case HISTOGRAM:
                c = fgetc(file);
                if (c != '\r' && c != '\n' && c != EOF)
                {
                    if (base64_len == capacity)
                    {
                        capacity *= 2;
                        base64_histogram = hdr_realloc(base64_histogram, capacity * sizeof(char));
                        if (NULL == base64_histogram)
                        {
                            FAIL_AND_CLEANUP(cleanup, result, -ENOMEM);
                        }
                    }
                    base64_histogram[base64_len++] = (char) c;
                }
                else
                {
                    state = DONE;
                }
                break;

            default:
                FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
        }
    }
    while (DONE != state);

    compressed_histogram = hdr_calloc(base64_len, sizeof(uint8_t));
    compressed_len = hdr_base64_decoded_len(base64_len);

    result = hdr_base64_decode(
        base64_histogram, base64_len, compressed_histogram, compressed_len);
    if (result != 0)
    {
        goto cleanup;
    }

    result = hdr_decode_compressed(compressed_histogram, compressed_len, histogram);

cleanup:
    hdr_free(base64_histogram);
    hdr_free(compressed_histogram);
    return result;
}